

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O2

void __thiscall
asio::detail::reactive_socket_service<asio::ip::tcp>::
async_accept<asio::basic_socket<asio::ip::tcp>,asio::detail::wrapped_handler<asio::io_context::strand,std::_Bind<void(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>*,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::function<void(std::error_code_const&)>,std::error_code_const&)>,asio::detail::is_continuation_if_running>>
          (reactive_socket_service<asio::ip::tcp> *this,implementation_type *impl,
          basic_socket<asio::ip::tcp> *peer,endpoint_type *peer_endpoint,
          wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>
          *handler)

{
  bool is_continuation;
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
  *this_00;
  ptr local_48;
  
  is_continuation = io_context::strand::running_in_this_thread(&handler->dispatcher_);
  local_48.h = handler;
  this_00 = reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
            ::ptr::allocate(handler);
  local_48.p = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
                *)0x0;
  local_48.v = this_00;
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
  ::reactive_socket_accept_op
            (this_00,(impl->super_base_implementation_type).socket_,
             (impl->super_base_implementation_type).state_,peer,&impl->protocol_,peer_endpoint,
             handler);
  local_48.p = this_00;
  reactive_socket_service_base::start_accept_op
            (&this->super_reactive_socket_service_base,&impl->super_base_implementation_type,
             (reactor_op *)this_00,is_continuation,
             (peer->
             super_basic_io_object<asio::detail::reactive_socket_service<asio::ip::tcp>,_true>).
             implementation_.super_base_implementation_type.socket_ != -1);
  local_48.v = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
                *)0x0;
  local_48.p = (reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
                *)0x0;
  reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp>,_asio::ip::tcp,_asio::detail::wrapped_handler<asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>::*(websocketpp::transport::asio::endpoint<websocketpp::config::asio::transport_config>_*,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>,_asio::detail::is_continuation_if_running>_>
  ::ptr::~ptr(&local_48);
  return;
}

Assistant:

void async_accept(implementation_type& impl, Socket& peer,
      endpoint_type* peer_endpoint, Handler& handler)
  {
    bool is_continuation =
      asio_handler_cont_helpers::is_continuation(handler);

    // Allocate and construct an operation to wrap the handler.
    typedef reactive_socket_accept_op<Socket, Protocol, Handler> op;
    typename op::ptr p = { asio::detail::addressof(handler),
      op::ptr::allocate(handler), 0 };
    p.p = new (p.v) op(impl.socket_, impl.state_, peer,
        impl.protocol_, peer_endpoint, handler);

    ASIO_HANDLER_CREATION((reactor_.context(), *p.p, "socket",
          &impl, impl.socket_, "async_accept"));

    start_accept_op(impl, p.p, is_continuation, peer.is_open());
    p.v = p.p = 0;
  }